

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O3

void __thiscall
absl::strings_internal::BigUnsigned<84>::MultiplyBy
          (BigUnsigned<84> *this,int other_size,uint32_t *other_words)

{
  uint uVar1;
  int original_size;
  int step;
  bool bVar3;
  uint uVar2;
  
  original_size = this->size_;
  uVar1 = original_size + other_size;
  if (1 < (int)uVar1) {
    uVar2 = 0x55;
    if (uVar1 < 0x55) {
      uVar2 = uVar1;
    }
    step = uVar2 - 2;
    do {
      MultiplyStep(this,original_size,other_words,other_size,step);
      bVar3 = step != 0;
      step = step + -1;
    } while (bVar3);
  }
  return;
}

Assistant:

void MultiplyBy(int other_size, const uint32_t* other_words) {
    const int original_size = size_;
    const int first_step =
        (std::min)(original_size + other_size - 2, max_words - 1);
    for (int step = first_step; step >= 0; --step) {
      MultiplyStep(original_size, other_words, other_size, step);
    }
  }